

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llist.c
# Opt level: O1

void Curl_llist_remove(Curl_llist *list,Curl_llist_element *e,void *user)

{
  size_t sVar1;
  void *pvVar2;
  Curl_llist_element *pCVar3;
  Curl_llist *pCVar4;
  
  if ((e != (Curl_llist_element *)0x0) && (sVar1 = list->size, sVar1 != 0)) {
    if (list->head == e) {
      pCVar4 = (Curl_llist *)e->next;
      list->head = (Curl_llist_element *)pCVar4;
      pCVar3 = (Curl_llist_element *)0x0;
    }
    else {
      pCVar3 = e->prev;
      pCVar4 = (Curl_llist *)&pCVar3->next;
      if (pCVar3 == (Curl_llist_element *)0x0) {
        pCVar4 = list;
      }
      pCVar4->head = e->next;
      pCVar4 = (Curl_llist *)e->next;
    }
    if (pCVar4 == (Curl_llist *)0x0) {
      pCVar4 = list;
    }
    pCVar4->tail = pCVar3;
    pvVar2 = e->ptr;
    e->ptr = (void *)0x0;
    e->prev = (Curl_llist_element *)0x0;
    e->next = (Curl_llist_element *)0x0;
    list->size = sVar1 - 1;
    if (list->dtor != (Curl_llist_dtor)0x0) {
      (*list->dtor)(user,pvVar2);
      return;
    }
  }
  return;
}

Assistant:

void
Curl_llist_remove(struct Curl_llist *list, struct Curl_llist_element *e,
                  void *user)
{
  void *ptr;
  if(e == NULL || list->size == 0)
    return;

  if(e == list->head) {
    list->head = e->next;

    if(list->head == NULL)
      list->tail = NULL;
    else
      e->next->prev = NULL;
  }
  else {
    if(!e->prev)
      list->head = e->next;
    else
      e->prev->next = e->next;

    if(!e->next)
      list->tail = e->prev;
    else
      e->next->prev = e->prev;
  }

  ptr = e->ptr;

  e->ptr  = NULL;
  e->prev = NULL;
  e->next = NULL;

  --list->size;

  /* call the dtor() last for when it actually frees the 'e' memory itself */
  if(list->dtor)
    list->dtor(user, ptr);
}